

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::ChainPromiseNode::setSelfPointer(ChainPromiseNode *this,Own<kj::_::PromiseNode> *selfPtr)

{
  if (*(int *)&(this->super_Event).field_0x24 == 1) {
    Own<kj::_::PromiseNode>::operator=(selfPtr,&this->inner);
    (*selfPtr->ptr->_vptr_PromiseNode[1])(selfPtr->ptr,selfPtr);
    return;
  }
  this->selfPtr = selfPtr;
  return;
}

Assistant:

void ChainPromiseNode::setSelfPointer(Own<PromiseNode>* selfPtr) noexcept {
  if (state == STEP2) {
    *selfPtr = kj::mv(inner);  // deletes this!
    selfPtr->get()->setSelfPointer(selfPtr);
  } else {
    this->selfPtr = selfPtr;
  }
}